

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O2

int16_t calc_average_fixed16(pooling_calc_context_t calc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int32_t iVar4;
  short *psVar5;
  long lVar6;
  short *psVar7;
  long lVar8;
  int iVar9;
  int kx;
  long lVar10;
  short *psVar11;
  int jx;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  long in_stack_00000030;
  
  if (in_stack_0000002c == 3) {
    lVar8 = (long)in_stack_00000008;
    if ((char)calc.hstride == '\0') {
      in_stack_00000028 =
           (in_stack_0000001c - in_stack_00000018) *
           (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
    }
    psVar5 = (short *)(*(long *)(in_stack_00000030 + 0x18) +
                      lVar8 * in_stack_00000020 * 2 +
                      (long)in_stack_00000010 * (long)in_stack_00000024 * 2 +
                      (long)in_stack_00000018 * 2 + (ulong)(uint)calc.dstart * 2);
    iVar3 = 0;
    for (; psVar11 = psVar5, lVar6 = (long)in_stack_00000010, lVar8 < in_stack_0000000c;
        lVar8 = lVar8 + 1) {
      for (; psVar7 = psVar11, lVar10 = (long)in_stack_00000018, lVar6 < in_stack_00000014;
          lVar6 = lVar6 + 1) {
        for (; lVar10 < in_stack_0000001c; lVar10 = lVar10 + 1) {
          iVar3 = iVar3 + *psVar7;
          psVar7 = psVar7 + 1;
        }
        psVar11 = psVar11 + in_stack_00000024;
      }
      psVar5 = psVar5 + in_stack_00000020;
    }
  }
  else {
    iVar3 = 0;
    if (in_stack_0000002c == 2) {
      lVar8 = (long)in_stack_00000008;
      if ((char)calc.hstride == '\0') {
        in_stack_00000028 =
             (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
      }
      iVar9 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010;
      iVar3 = 0;
      for (; lVar8 < in_stack_0000000c; lVar8 = lVar8 + 1) {
        for (lVar6 = (long)iVar9; lVar6 < lVar8 * in_stack_00000020 + (long)in_stack_00000014;
            lVar6 = lVar6 + 1) {
          iVar3 = iVar3 + *(short *)(*(long *)(in_stack_00000030 + 0x18) +
                                     (ulong)(uint)calc.dstart * 2 + lVar6 * 2);
        }
        iVar9 = iVar9 + in_stack_00000020;
      }
    }
  }
  iVar4 = rescale_scalar_fixed32
                    ((int)(short)(iVar3 / in_stack_00000028),
                     (uint)(*(byte *)(in_stack_00000030 + 0x10) >> 4),
                     (uint)(*(byte *)(calc._0_8_ + 0x10) >> 4));
  sVar1 = (short)iVar4;
  sVar2 = sVar1;
  if (sVar1 < -0x7fff) {
    sVar2 = -0x8000;
  }
  if (0x7ffe < sVar1) {
    sVar2 = 0x7fff;
  }
  return sVar2;
}

Assistant:

int16_t calc_average_fixed16(pooling_calc_context_t calc) {
  int32_t val = 0;
  int16_t average_val = 0;
  int16_t *x = (int16_t *)(calc.x->data);
  if (calc.kernel_size == 2) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        val += *(x + jx + calc.offset_x);
      }
    }
  } else if (calc.kernel_size == 3) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart) *
                       (calc.dend - calc.dstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          val +=
              *(x + ix * calc.hstride + jx * calc.wstride + kx + calc.offset_x);
        }
      }
    }
  }
  average_val = val / calc.pool_size;
  average_val =
      rescale_scalar_fixed32(average_val, calc.x->fp_pos, calc.y->fp_pos);
  average_val = saturate32_to_16(average_val);
  return average_val;
}